

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall QGridLayoutPrivate::recalcHFW(QGridLayoutPrivate *this,int w)

{
  int iVar1;
  const_reference pQVar2;
  int *piVar3;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int spacing;
  int r;
  QList<QLayoutStruct> *rData;
  int mh;
  int h;
  QGridLayoutPrivate *in_stack_00000058;
  qsizetype in_stack_ffffffffffffffb8;
  int *a;
  QList<QLayoutStruct> *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0xe8) == 0) {
    in_stack_ffffffffffffffc0 = (QList<QLayoutStruct> *)operator_new(0x18);
    QList<QLayoutStruct>::QList(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(QList<QLayoutStruct> **)(in_RDI + 0xe8) = in_stack_ffffffffffffffc0;
  }
  setupHfwLayoutData(in_stack_00000058);
  local_c = 0;
  local_10 = 0;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0xb0); local_2c = local_2c + 1) {
    pQVar2 = QList<QLayoutStruct>::at(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    iVar1 = pQVar2->spacing;
    pQVar2 = QList<QLayoutStruct>::at(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_c = pQVar2->sizeHint + iVar1 + local_c;
    pQVar2 = QList<QLayoutStruct>::at(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_10 = pQVar2->minimumSize + iVar1 + local_10;
  }
  *(undefined4 *)(in_RDI + 0x168) = in_ESI;
  a = &QLAYOUTSIZE_MAX;
  piVar3 = qMin<int>(&QLAYOUTSIZE_MAX,&local_c);
  *(int *)(in_RDI + 0x16c) = *piVar3;
  piVar3 = qMin<int>(a,&local_10);
  *(int *)(in_RDI + 0x170) = *piVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayoutPrivate::recalcHFW(int w)
{
    /*
      Go through all children, using colData and heightForWidth()
      and put the results in hfwData.
    */
    if (!hfwData)
        hfwData = new QList<QLayoutStruct>(rr);
    setupHfwLayoutData();
    QList<QLayoutStruct> &rData = *hfwData;

    int h = 0;
    int mh = 0;
    for (int r = 0; r < rr; r++) {
        int spacing = rData.at(r).spacing;
        h += rData.at(r).sizeHint + spacing;
        mh += rData.at(r).minimumSize + spacing;
    }

    hfw_width = w;
    hfw_height = qMin(QLAYOUTSIZE_MAX, h);
    hfw_minheight = qMin(QLAYOUTSIZE_MAX, mh);
}